

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.c
# Opt level: O0

unsigned_long ffdsum(char *ascii,int complm,unsigned_long *sum)

{
  int ii;
  unsigned_long locarry;
  unsigned_long hicarry;
  unsigned_long lo;
  unsigned_long hi;
  char cbuf [16];
  unsigned_long *sum_local;
  int complm_local;
  char *ascii_local;
  
  hi = 0;
  lo = 0;
  for (ii = 0; ii < 0x10; ii = ii + 1) {
    cbuf[ii] = ascii[(ii + 1) % 0x10];
    cbuf[ii] = cbuf[ii] + -0x30;
  }
  for (ii = 0; ii < 0x10; ii = ii + 4) {
    hi = (long)(cbuf[ii] * 0x100 + (int)cbuf[ii + 1]) + hi;
    lo = (long)(cbuf[ii + 2] * 0x100 + (int)cbuf[ii + 3]) + lo;
  }
  while( true ) {
    hicarry = hi >> 0x10;
    locarry = lo >> 0x10;
    if (hicarry == 0 && locarry == 0) break;
    hi = (hi & 0xffff) + locarry;
    lo = (lo & 0xffff) + hicarry;
  }
  *sum = hi * 0x10000 + lo;
  if (complm != 0) {
    *sum = 0xffffffff - *sum;
  }
  return *sum;
}

Assistant:

unsigned long ffdsum(char *ascii,  /* I - 16-char ASCII encoded checksum   */
                     int complm,   /* I - =1 to decode complement of the   */
                     unsigned long *sum)  /* O - 32-bit checksum           */
/*
    decode the 16-char ASCII encoded checksum into an unsigned 32-bit long.
    If complm=TRUE, then the complement of the sum will be decoded.

    This routine is based on the C algorithm developed by Rob
    Seaman at NOAO that was presented at the 1994 ADASS conference,
    published in the Astronomical Society of the Pacific Conference Series.
*/
{
    char cbuf[16];
    unsigned long hi = 0, lo = 0, hicarry, locarry;
    int ii;

    /* remove the permuted FITS byte alignment and the ASCII 0 offset */
    for (ii = 0; ii < 16; ii++)
    {
        cbuf[ii] = ascii[(ii+1)%16];
        cbuf[ii] -= 0x30;
    }

    for (ii = 0; ii < 16; ii += 4)
    {
        hi += (cbuf[ii]   << 8) + cbuf[ii+1];
        lo += (cbuf[ii+2] << 8) + cbuf[ii+3];
    }

    hicarry = hi >> 16;
    locarry = lo >> 16;
    while (hicarry || locarry)
    {
        hi = (hi & 0xFFFF) + locarry;
        lo = (lo & 0xFFFF) + hicarry;
        hicarry = hi >> 16;
        locarry = lo >> 16;
    }

    *sum = (hi << 16) + lo;
    if (complm)
        *sum = 0xFFFFFFFF - *sum;   /* complement each bit of the value */

    return(*sum);
}